

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

bool __thiscall
Assimp::X3DExporter::CheckAndExport_Light(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  int iVar1;
  bool bVar2;
  aiMatrix4x4t<float> *paVar3;
  DeadlyImportError *this_00;
  aiString *other;
  long lVar4;
  aiVector3t<float> aVar5;
  allocator<char> local_121;
  undefined1 local_120 [64];
  aiVector3D local_e0;
  aiVector3D local_d0;
  aiVector3D local_c0;
  undefined1 local_b0 [8];
  ai_real local_a8;
  anon_class_16_2_65aab299 Vec3ToAttrList;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  aiMatrix4x4 trafo_mat;
  
  Vec3ToAttrList.attr_list = &attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  Vec3ToAttrList.this = this;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)Vec3ToAttrList.attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)Vec3ToAttrList.attr_list;
  if ((pNode->mName).length != 0) {
    lVar4 = 0;
    while (this->mScene->mNumLights != 0) {
      other = *(aiString **)((long)this->mScene->mLights + lVar4);
      bVar2 = aiString::operator==(&pNode->mName,other);
      if (bVar2) {
        lVar4 = *(long *)((long)this->mScene->mLights + lVar4);
        Matrix_GlobalToCurrent((aiMatrix4x4 *)local_120,(X3DExporter *)other,pNode);
        paVar3 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_120);
        trafo_mat.a1 = paVar3->a1;
        trafo_mat.a2 = paVar3->a2;
        trafo_mat.a3 = paVar3->a3;
        trafo_mat.a4 = paVar3->a4;
        trafo_mat.b1 = paVar3->b1;
        trafo_mat.b2 = paVar3->b2;
        trafo_mat.b3 = paVar3->b3;
        trafo_mat.b4 = paVar3->b4;
        trafo_mat.c1 = paVar3->c1;
        trafo_mat.c2 = paVar3->c2;
        trafo_mat.c3 = paVar3->c3;
        trafo_mat.c4 = paVar3->c4;
        trafo_mat.d1 = paVar3->d1;
        trafo_mat.d2 = paVar3->d2;
        trafo_mat.d3 = paVar3->d3;
        trafo_mat.d4 = paVar3->d4;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_120,"DEF",(allocator<char> *)local_b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_120 + 0x20),(char *)(lVar4 + 4),(allocator<char> *)&local_e0);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back(&attr_list,(value_type *)local_120);
        SAttribute::~SAttribute((SAttribute *)local_120);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_120,"global",(allocator<char> *)local_b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_120 + 0x20),"true",(allocator<char> *)&local_e0);
        std::__cxx11::
        list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
        push_back(&attr_list,(value_type *)local_120);
        SAttribute::~SAttribute((SAttribute *)local_120);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_120,"ambientIntensity",(allocator<char> *)local_b0);
        AttrHelper_FloatToAttrList
                  (this,&attr_list,(string *)local_120,
                   SQRT(*(float *)(lVar4 + 0x458) * *(float *)(lVar4 + 0x458) +
                        *(float *)(lVar4 + 0x450) * *(float *)(lVar4 + 0x450) +
                        *(float *)(lVar4 + 0x454) * *(float *)(lVar4 + 0x454)),0.0);
        std::__cxx11::string::~string((string *)local_120);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_120,"color",(allocator<char> *)&local_e0);
        local_b0 = (undefined1  [8])0x3f8000003f800000;
        local_a8 = 1.0;
        AttrHelper_Color3ToAttrList
                  (this,&attr_list,(string *)local_120,(aiColor3D *)(lVar4 + 0x438),
                   (aiColor3D *)local_b0);
        std::__cxx11::string::~string((string *)local_120);
        iVar1 = *(int *)(lVar4 + 0x404);
        if (iVar1 == 1) {
          aVar5 = ::operator*(&trafo_mat,(aiVector3t<float> *)(lVar4 + 0x414));
          local_a8 = aVar5.z;
          local_b0 = aVar5._0_8_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"direction",(allocator<char> *)&local_c0);
          local_e0.x = 0.0;
          local_e0.y = 0.0;
          local_e0.z = -1.0;
          CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                    (&Vec3ToAttrList,(string *)local_120,(aiVector3D *)local_b0,&local_e0);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"DirectionalLight",(allocator<char> *)&local_e0);
          NodeHelper_OpenNode(this,(string *)local_120,pTabLevel,true,&attr_list);
        }
        else if (iVar1 == 2) {
          local_a8 = *(float *)(lVar4 + 0x434);
          local_b0 = *(undefined1 (*) [8])(lVar4 + 0x42c);
          aVar5 = ::operator*(&trafo_mat,(aiVector3t<float> *)(lVar4 + 0x408));
          local_e0.z = aVar5.z;
          local_e0._0_8_ = aVar5._0_8_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"attenuation",(allocator<char> *)&local_d0);
          local_c0.x = 1.0;
          local_c0.y = 0.0;
          local_c0.z = 0.0;
          CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                    (&Vec3ToAttrList,(string *)local_120,(aiVector3D *)local_b0,&local_c0);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"location",(allocator<char> *)&local_d0);
          local_c0.x = 0.0;
          local_c0.y = 0.0;
          local_c0.z = 0.0;
          CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                    (&Vec3ToAttrList,(string *)local_120,&local_e0,&local_c0);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"PointLight",(allocator<char> *)&local_c0);
          NodeHelper_OpenNode(this,(string *)local_120,pTabLevel,true,&attr_list);
        }
        else {
          if (iVar1 != 3) {
            this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            to_string<aiLightSourceType>((string *)local_b0,*(aiLightSourceType *)(lVar4 + 0x404));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120,"Unknown light type: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0);
            DeadlyImportError::DeadlyImportError(this_00,(string *)local_120);
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_a8 = *(float *)(lVar4 + 0x434);
          local_b0 = *(undefined1 (*) [8])(lVar4 + 0x42c);
          aVar5 = ::operator*(&trafo_mat,(aiVector3t<float> *)(lVar4 + 0x408));
          local_e0.z = aVar5.z;
          local_e0._0_8_ = aVar5._0_8_;
          aVar5 = ::operator*(&trafo_mat,(aiVector3t<float> *)(lVar4 + 0x414));
          local_c0.z = aVar5.z;
          local_c0._0_8_ = aVar5._0_8_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"attenuation",&local_121);
          local_d0.x = 1.0;
          local_d0.y = 0.0;
          local_d0.z = 0.0;
          CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                    (&Vec3ToAttrList,(string *)local_120,(aiVector3D *)local_b0,&local_d0);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"location",&local_121);
          local_d0.x = 0.0;
          local_d0.y = 0.0;
          local_d0.z = 0.0;
          CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                    (&Vec3ToAttrList,(string *)local_120,&local_e0,&local_d0);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"direction",&local_121);
          local_d0.x = 0.0;
          local_d0.y = 0.0;
          local_d0.z = -1.0;
          CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                    (&Vec3ToAttrList,(string *)local_120,&local_c0,&local_d0);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"beamWidth",(allocator<char> *)&local_d0);
          AttrHelper_FloatToAttrList
                    (this,&attr_list,(string *)local_120,*(float *)(lVar4 + 0x45c),0.7854);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"cutOffAngle",(allocator<char> *)&local_d0);
          AttrHelper_FloatToAttrList
                    (this,&attr_list,(string *)local_120,*(float *)(lVar4 + 0x460),1.570796);
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_120,"SpotLight",(allocator<char> *)&local_d0);
          NodeHelper_OpenNode(this,(string *)local_120,pTabLevel,true,&attr_list);
        }
        std::__cxx11::string::~string((string *)local_120);
        bVar2 = true;
        goto LAB_0035d48f;
      }
      lVar4 = lVar4 + 8;
    }
  }
  bVar2 = false;
LAB_0035d48f:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          );
  return bVar2;
}

Assistant:

bool X3DExporter::CheckAndExport_Light(const aiNode& pNode, const size_t pTabLevel)
{
list<SAttribute> attr_list;

auto Vec3ToAttrList = [&](const string& pAttrName, const aiVector3D& pAttrValue, const aiVector3D& pAttrDefaultValue)
{
	string tstr;

	if(pAttrValue != pAttrDefaultValue)
	{
		AttrHelper_Vec3DArrToString(&pAttrValue, 1, tstr);
		attr_list.push_back({pAttrName, tstr});
	}
};

size_t idx_light;
bool found = false;

	// Name of the light source can not be empty.
	if(pNode.mName.length == 0) return false;

	// search for light with name like node has.
	for(idx_light = 0; mScene->mNumLights; idx_light++)
	{
		if(pNode.mName == mScene->mLights[idx_light]->mName)
		{
			found = true;
			break;
		}
	}

	if(!found) return false;

	// Light source is found.
	const aiLight& light = *mScene->mLights[idx_light];// Alias for conveniance.

	aiMatrix4x4 trafo_mat = Matrix_GlobalToCurrent(pNode).Inverse();

	attr_list.push_back({"DEF", light.mName.C_Str()});
	attr_list.push_back({"global", "true"});// "false" is not supported.
	// ambientIntensity="0" SFFloat [inputOutput]
	AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", aiVector3D(light.mColorAmbient.r, light.mColorAmbient.g, light.mColorAmbient.b).Length(), 0);
	// color="1 1 1"        SFColor [inputOutput]
	AttrHelper_Color3ToAttrList(attr_list, "color", light.mColorDiffuse, aiColor3D(1, 1, 1));

	switch(light.mType)
	{
		case aiLightSource_DIRECTIONAL:
			{
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				NodeHelper_OpenNode("DirectionalLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_POINT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				NodeHelper_OpenNode("PointLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_SPOT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				AttrHelper_FloatToAttrList(attr_list, "beamWidth", light.mAngleInnerCone, 0.7854f);
				AttrHelper_FloatToAttrList(attr_list, "cutOffAngle", light.mAngleOuterCone, 1.570796f);
				NodeHelper_OpenNode("SpotLight", pTabLevel, true, attr_list);
			}

			break;
		default:
			throw DeadlyExportError("Unknown light type: " + to_string(light.mType));
	}// switch(light.mType)

	return true;
}